

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

void ssh1_connection_process_queue(PacketProtocolLayer *ppl)

{
  Seat **s;
  int iVar1;
  uint type;
  PktInQueue *pPVar2;
  Ssh *ssh;
  _Bool _Var3;
  prompts_t *ppVar4;
  InteractionReadySeat IVar5;
  PktIn *pPVar6;
  char *pcVar7;
  undefined1 local_40 [32];
  
  s = &ppl[-3].seat;
  _Var3 = ssh1_connection_filter_queue((ssh1_connection_state *)s);
  if (_Var3) {
    return;
  }
  iVar1 = *(int *)s;
  if (iVar1 < 0x18e) {
    if (iVar1 == 0) {
      _Var3 = ssh1_connection_need_antispoof_prompt((ssh1_connection_state *)s);
      if (_Var3) {
        ppVar4 = ssh_ppl_new_prompts(ppl);
        ppl[-1].ic_process_queue.ctx = ppVar4;
        ppVar4->to_server = true;
        ppVar4->from_server = false;
        pcVar7 = dupstr("Authentication successful");
        ppVar4 = (prompts_t *)ppl[-1].ic_process_queue.ctx;
        ppVar4->name = pcVar7;
        pcVar7 = dupstr("Access granted. Press Return to begin session. ");
        add_prompt(ppVar4,pcVar7,false);
        goto LAB_001208b0;
      }
    }
    else {
      if (iVar1 != 0x181) {
LAB_00120857:
        *(undefined4 *)s = 0;
        return;
      }
LAB_001208b0:
      IVar5 = interactor_announce(ppl->interactor);
      (*(IVar5.seat)->vt->get_userpass_input)
                ((SeatPromptResult *)local_40,IVar5.seat,(prompts_t *)ppl[-1].ic_process_queue.ctx);
      ppl[-1].logctx = (LogContext *)local_40._16_8_;
      ppl[-1].seat = (Seat *)local_40._24_8_;
      *(undefined8 *)&ppl[-1].ic_process_queue.queued = local_40._0_8_;
      ppl[-1].selfptr = (PacketProtocolLayer **)local_40._8_8_;
      if (*(int *)&ppl[-1].ic_process_queue.queued == 0) {
        *(undefined4 *)s = 0x181;
        return;
      }
      free_prompts((prompts_t *)ppl[-1].ic_process_queue.ctx);
      ppl[-1].ic_process_queue.ctx = (void *)0x0;
    }
    portfwdmgr_config((PortFwdManager *)ppl[-1].vt,(Conf *)ppl[-3].interactor);
    *(undefined1 *)&ppl[-1].bpp = 1;
  }
  else if (iVar1 != 0x18e) {
    if (iVar1 != 0x19f) goto LAB_00120857;
    goto LAB_00120919;
  }
  if (*(char *)((long)&ppl[-1].bpp + 1) == '\0') {
    ssh1_connection_direction_specific_setup((ssh1_connection_state *)s);
    *(undefined4 *)s = 0x18e;
    return;
  }
LAB_00120919:
  ssh1_connection_filter_queue((ssh1_connection_state *)s);
  pPVar2 = ppl->in_pq;
  pPVar6 = (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,true);
  if (pPVar6 == (PktIn *)0x0) {
    *(undefined4 *)s = 0x19f;
  }
  else {
    ssh = ppl->ssh;
    type = pPVar6->type;
    pcVar7 = ssh1_pkt_type(type);
    ssh_proto_error(ssh,"Unexpected packet received, type %d (%s)",(ulong)type,pcVar7);
  }
  return;
}

Assistant:

static void ssh1_connection_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh1_connection_state *s =
        container_of(ppl, struct ssh1_connection_state, ppl);
    PktIn *pktin;

    if (ssh1_connection_filter_queue(s)) /* no matter why we were called */
        return;

    crBegin(s->crState);

    /*
     * Signal the seat that authentication is done, so that it can
     * deploy spoofing defences. If it doesn't have any, deploy our
     * own fallback one.
     *
     * We do this here rather than at the end of userauth, because we
     * might not have gone through userauth at all (if we're a
     * connection-sharing downstream).
     */
    if (ssh1_connection_need_antispoof_prompt(s)) {
        s->antispoof_prompt = ssh_ppl_new_prompts(&s->ppl);
        s->antispoof_prompt->to_server = true;
        s->antispoof_prompt->from_server = false;
        s->antispoof_prompt->name = dupstr("Authentication successful");
        add_prompt(
            s->antispoof_prompt,
            dupstr("Access granted. Press Return to begin session. "), false);
        s->antispoof_ret = seat_get_userpass_input(
            ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        while (s->antispoof_ret.kind == SPRK_INCOMPLETE) {
            crReturnV;
            s->antispoof_ret = seat_get_userpass_input(
                ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        }
        free_prompts(s->antispoof_prompt);
        s->antispoof_prompt = NULL;
    }

    portfwdmgr_config(s->portfwdmgr, s->conf);
    s->portfwdmgr_configured = true;

    while (!s->finished_setup) {
        ssh1_connection_direction_specific_setup(s);
        crReturnV;
    }

    while (1) {

        /*
         * By this point, most incoming packets are already being
         * handled by filter_queue, and we need only pay attention to
         * the unusual ones.
         */

        if ((pktin = ssh1_connection_pop(s)) != NULL) {
            ssh_proto_error(s->ppl.ssh, "Unexpected packet received, "
                            "type %d (%s)", pktin->type,
                            ssh1_pkt_type(pktin->type));
            return;
        }
        crReturnV;
    }

    crFinishV;
}